

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O1

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,-1,0,3,-1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,_1,0,3,_1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  size_type i;
  undefined8 *puVar4;
  node_type *pnVar5;
  long lVar6;
  long lVar7;
  node_type *pnVar8;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  box_type right;
  
  lVar6 = *(long *)(this + 0x20);
  if (*(long *)(lVar6 + 0x10) == 0x100) {
    puVar4 = (undefined8 *)operator_new(0x2008);
    *puVar4 = *(undefined8 *)(lVar6 + 8);
    *(undefined8 **)(lVar6 + 8) = puVar4;
    *(undefined8 **)(lVar6 + 0x18) = puVar4 + 1;
    *(undefined8 *)(lVar6 + 0x10) = 0;
  }
  pnVar8 = (node_type *)(*(long *)(lVar6 + 0x10) * 0x20 + *(long *)(lVar6 + 0x18));
  *(long *)(lVar6 + 0x10) = *(long *)(lVar6 + 0x10) + 1;
  if ((long)*(int *)(this + 8) < (long)end._M_current - (long)begin._M_current >> 2) {
    split._M_current = (int *)0x0;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,-1,0,3,-1>,0,Eigen::Stride<0,0>>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,_1,0,3,_1>,0,Eigen::Stride<0,0>>>>
                  *)(this + 0x10),depth,begin,end,box,&split,&split_dim,&split_val);
    right.storage_.coords_max._M_elems._4_8_ =
         *(undefined8 *)((box->storage_).coords_max._M_elems + 1);
    right.storage_.coords_min._M_elems._0_8_ = *(undefined8 *)(box->storage_).coords_min._M_elems;
    right.storage_._8_8_ = *(undefined8 *)((box->storage_).coords_min._M_elems + 2);
    (box->storage_).coords_max._M_elems[split_dim] = split_val;
    right.storage_.coords_min._M_elems[split_dim] = split_val;
    pnVar5 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,begin,split,box);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
         = pnVar5;
    pnVar5 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,split,end,&right);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = pnVar5;
    (pnVar8->data).branch.split_dim = (int)split_dim;
    (pnVar8->data).branch.left_max = (box->storage_).coords_max._M_elems[split_dim];
    (pnVar8->data).branch.right_min = right.storage_.coords_min._M_elems[split_dim];
    lVar6 = 0;
    do {
      fVar3 = right.storage_.coords_min._M_elems[lVar6];
      if (fVar3 < (box->storage_).coords_min._M_elems[lVar6]) {
        (box->storage_).coords_min._M_elems[lVar6] = fVar3;
      }
      fVar3 = right.storage_.coords_max._M_elems[lVar6];
      pfVar2 = (box->storage_).coords_max._M_elems + lVar6;
      if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
        (box->storage_).coords_max._M_elems[lVar6] = fVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  else {
    lVar6 = **(long **)(this + 0x18);
    (pnVar8->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar6) >> 2);
    (pnVar8->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar6) >> 2);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
         = (kd_tree_node_euclidean<int,_float> *)0x0;
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = (kd_tree_node_euclidean<int,_float> *)0x0;
    lVar6 = -0xc;
    do {
      *(undefined4 *)((long)(box->storage_).coords_max._M_elems + lVar6) = 0x7f7fffff;
      *(undefined4 *)((long)box[1].storage_.coords_min._M_elems + lVar6) = 0xff7fffff;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    if (begin._M_current < end._M_current) {
      lVar6 = *(long *)**(undefined8 **)this;
      do {
        lVar1 = lVar6 + (long)*begin._M_current * 0xc;
        lVar7 = 0;
        do {
          fVar3 = *(float *)(lVar1 + lVar7 * 4);
          if (fVar3 < (box->storage_).coords_min._M_elems[lVar7]) {
            (box->storage_).coords_min._M_elems[lVar7] = fVar3;
          }
          fVar3 = *(float *)(lVar1 + lVar7 * 4);
          pfVar2 = (box->storage_).coords_max._M_elems + lVar7;
          if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
            (box->storage_).coords_max._M_elems[lVar7] = fVar3;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        begin._M_current = begin._M_current + 1;
      } while (begin._M_current < end._M_current);
    }
  }
  return pnVar8;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }